

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool CoreML::Specification::Pooling3DLayerParams_Pooling3DPaddingType_IsValid(int value)

{
  return (uint)value < 3;
}

Assistant:

bool Pooling3DLayerParams_Pooling3DPaddingType_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}